

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# depth_first_traverser.h
# Opt level: O2

bool __thiscall
draco::
DepthFirstTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
::TraverseFromCorner
          (DepthFirstTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
           *this,CornerIndex corner_id)

{
  vector<bool,_std::allocator<bool>_> *this_00;
  pointer *ppIVar1;
  VertexIndex VVar2;
  CornerTable *pCVar3;
  bool bVar4;
  const_reference cVar5;
  bool bVar6;
  value_type vVar7;
  uint uVar8;
  CornerIndex CVar9;
  pointer pIVar10;
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_> vert_id;
  ulong uVar11;
  ulong uVar12;
  value_type local_50;
  CornerIndex right_corner_id;
  
  local_50.value_ = corner_id.value_;
  bVar4 = TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
          ::IsFaceVisited(&this->
                           super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                          ,corner_id);
  if (!bVar4) {
    pIVar10 = (this->corner_traversal_stack_).
              super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((this->corner_traversal_stack_).
        super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != pIVar10) {
      (this->corner_traversal_stack_).
      super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pIVar10;
    }
    std::
    vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
    ::push_back(&this->corner_traversal_stack_,&local_50);
    if (local_50.value_ == 0xffffffff) {
      return false;
    }
    pCVar3 = (this->
             super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
             ).corner_table_;
    uVar8 = local_50.value_ - 2;
    if ((local_50.value_ + 1) % 3 != 0) {
      uVar8 = local_50.value_ + 1;
    }
    if (uVar8 == 0xffffffff) {
      vert_id.value_ = 0xffffffff;
    }
    else {
      vert_id.value_ =
           (pCVar3->corner_to_vertex_map_).vector_.
           super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar8].value_;
    }
    if (local_50.value_ % 3 == 0) {
      uVar8 = local_50.value_ + 2;
      if (uVar8 == 0xffffffff) {
        return false;
      }
    }
    else {
      uVar8 = local_50.value_ - 1;
    }
    if (vert_id.value_ == 0xffffffff) {
      return false;
    }
    VVar2.value_ = (pCVar3->corner_to_vertex_map_).vector_.
                   super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar8].value_;
    if (VVar2.value_ == 0xffffffff) {
      return false;
    }
    this_00 = &(this->
               super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
               ).is_vertex_visited_;
    cVar5 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,(ulong)vert_id.value_);
    if (!cVar5) {
      TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
      ::MarkVertexVisited(&this->
                           super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                          ,(VertexIndex)vert_id.value_);
      if (local_50.value_ == 0xffffffff) {
        CVar9.value_ = 0xffffffff;
      }
      else {
        CVar9.value_ = local_50.value_ - 2;
        if ((local_50.value_ + 1) % 3 != 0) {
          CVar9.value_ = local_50.value_ + 1;
        }
      }
      MeshAttributeIndicesEncodingObserver<draco::CornerTable>::OnNewVertexVisited
                (&(this->
                  super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                  ).traversal_observer_,(VertexIndex)vert_id.value_,CVar9);
    }
    cVar5 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,(ulong)VVar2.value_);
    if (!cVar5) {
      TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
      ::MarkVertexVisited(&this->
                           super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                          ,VVar2);
      if (local_50.value_ == 0xffffffff) {
        CVar9.value_ = 0xffffffff;
      }
      else if (local_50.value_ % 3 == 0) {
        CVar9.value_ = local_50.value_ + 2;
      }
      else {
        CVar9.value_ = local_50.value_ - 1;
      }
      MeshAttributeIndicesEncodingObserver<draco::CornerTable>::OnNewVertexVisited
                (&(this->
                  super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                  ).traversal_observer_,VVar2,CVar9);
    }
LAB_00125b99:
    pIVar10 = (this->corner_traversal_stack_).
              super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if ((this->corner_traversal_stack_).
        super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != pIVar10) {
      local_50.value_ = pIVar10[-1].value_;
      if (local_50.value_ == 0xffffffff) {
LAB_00125bd7:
        (this->corner_traversal_stack_).
        super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = pIVar10 + -1;
      }
      else {
        uVar11 = (ulong)local_50.value_;
        bVar4 = TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                ::IsFaceVisited(&this->
                                 super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                                ,(FaceIndex)(uint)(uVar11 / 3));
        uVar11 = uVar11 / 3;
        vVar7.value_ = local_50.value_;
        if (bVar4) {
          pIVar10 = (this->corner_traversal_stack_).
                    super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          goto LAB_00125bd7;
        }
LAB_00125be4:
        do {
          local_50.value_ = vVar7.value_;
          TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
          ::MarkFaceVisited(&this->
                             super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                            ,(FaceIndex)(uint)uVar11);
          if ((ulong)local_50.value_ == 0xffffffff) {
            return false;
          }
          VVar2.value_ = (((this->
                           super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                           ).corner_table_)->corner_to_vertex_map_).vector_.
                         super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[local_50.value_].value_;
          if ((ulong)VVar2.value_ == 0xffffffff) {
            return false;
          }
          cVar5 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,(ulong)VVar2.value_);
          if (!cVar5) {
            bVar4 = CornerTable::IsOnBoundary
                              ((this->
                               super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                               ).corner_table_,VVar2);
            TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
            ::MarkVertexVisited(&this->
                                 super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                                ,VVar2);
            MeshAttributeIndicesEncodingObserver<draco::CornerTable>::OnNewVertexVisited
                      (&(this->
                        super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                        ).traversal_observer_,VVar2,(CornerIndex)local_50.value_);
            if (!bVar4) {
              vVar7.value_ = (uint)CornerTable::GetRightCorner
                                             ((this->
                                              super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                                              ).corner_table_,local_50.value_);
              uVar11 = (ulong)vVar7.value_ / 3;
              goto LAB_00125be4;
            }
          }
          right_corner_id =
               CornerTable::GetRightCorner
                         ((this->
                          super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                          ).corner_table_,local_50.value_);
          CVar9 = CornerTable::GetLeftCorner
                            ((this->
                             super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                             ).corner_table_,local_50.value_);
          uVar11 = (ulong)right_corner_id.value_ / 3;
          if (right_corner_id.value_ == 0xffffffff) {
            uVar11 = 0xffffffff;
          }
          uVar12 = (ulong)CVar9.value_ / 3;
          if (CVar9.value_ == 0xffffffff) {
            uVar12 = 0xffffffff;
          }
          bVar4 = TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                  ::IsFaceVisited(&this->
                                   super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                                  ,(FaceIndex)(uint)uVar11);
          bVar6 = TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                  ::IsFaceVisited(&this->
                                   super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                                  ,(FaceIndex)(uint)uVar12);
          if (bVar4) {
            uVar11 = uVar12;
            vVar7.value_ = CVar9.value_;
            if (bVar6) {
              ppIVar1 = &(this->corner_traversal_stack_).
                         super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              *ppIVar1 = *ppIVar1 + -1;
              goto LAB_00125b99;
            }
            goto LAB_00125be4;
          }
          vVar7.value_ = right_corner_id;
        } while (bVar6);
        (this->corner_traversal_stack_).
        super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish[-1].value_ = CVar9.value_;
        std::
        vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
        ::push_back(&this->corner_traversal_stack_,&right_corner_id);
      }
      goto LAB_00125b99;
    }
  }
  return true;
}

Assistant:

bool TraverseFromCorner(CornerIndex corner_id) {
    if (this->IsFaceVisited(corner_id)) {
      return true;  // Already traversed.
    }

    corner_traversal_stack_.clear();
    corner_traversal_stack_.push_back(corner_id);
    // For the first face, check the remaining corners as they may not be
    // processed yet.
    const VertexIndex next_vert =
        this->corner_table()->Vertex(this->corner_table()->Next(corner_id));
    const VertexIndex prev_vert =
        this->corner_table()->Vertex(this->corner_table()->Previous(corner_id));
    if (next_vert == kInvalidVertexIndex || prev_vert == kInvalidVertexIndex) {
      return false;
    }
    if (!this->IsVertexVisited(next_vert)) {
      this->MarkVertexVisited(next_vert);
      this->traversal_observer().OnNewVertexVisited(
          next_vert, this->corner_table()->Next(corner_id));
    }
    if (!this->IsVertexVisited(prev_vert)) {
      this->MarkVertexVisited(prev_vert);
      this->traversal_observer().OnNewVertexVisited(
          prev_vert, this->corner_table()->Previous(corner_id));
    }

    // Start the actual traversal.
    while (!corner_traversal_stack_.empty()) {
      // Currently processed corner.
      corner_id = corner_traversal_stack_.back();
      FaceIndex face_id(corner_id.value() / 3);
      // Make sure the face hasn't been visited yet.
      if (corner_id == kInvalidCornerIndex || this->IsFaceVisited(face_id)) {
        // This face has been already traversed.
        corner_traversal_stack_.pop_back();
        continue;
      }
      while (true) {
        this->MarkFaceVisited(face_id);
        this->traversal_observer().OnNewFaceVisited(face_id);
        const VertexIndex vert_id = this->corner_table()->Vertex(corner_id);
        if (vert_id == kInvalidVertexIndex) {
          return false;
        }
        if (!this->IsVertexVisited(vert_id)) {
          const bool on_boundary = this->corner_table()->IsOnBoundary(vert_id);
          this->MarkVertexVisited(vert_id);
          this->traversal_observer().OnNewVertexVisited(vert_id, corner_id);
          if (!on_boundary) {
            corner_id = this->corner_table()->GetRightCorner(corner_id);
            face_id = FaceIndex(corner_id.value() / 3);
            continue;
          }
        }
        // The current vertex has been already visited or it was on a boundary.
        // We need to determine whether we can visit any of it's neighboring
        // faces.
        const CornerIndex right_corner_id =
            this->corner_table()->GetRightCorner(corner_id);
        const CornerIndex left_corner_id =
            this->corner_table()->GetLeftCorner(corner_id);
        const FaceIndex right_face_id(
            (right_corner_id == kInvalidCornerIndex
                 ? kInvalidFaceIndex
                 : FaceIndex(right_corner_id.value() / 3)));
        const FaceIndex left_face_id(
            (left_corner_id == kInvalidCornerIndex
                 ? kInvalidFaceIndex
                 : FaceIndex(left_corner_id.value() / 3)));
        if (this->IsFaceVisited(right_face_id)) {
          // Right face has been already visited.
          if (this->IsFaceVisited(left_face_id)) {
            // Both neighboring faces are visited. End reached.
            corner_traversal_stack_.pop_back();
            break;  // Break from the while (true) loop.
          } else {
            // Go to the left face.
            corner_id = left_corner_id;
            face_id = left_face_id;
          }
        } else {
          // Right face was not visited.
          if (this->IsFaceVisited(left_face_id)) {
            // Left face visited, go to the right one.
            corner_id = right_corner_id;
            face_id = right_face_id;
          } else {
            // Both neighboring faces are unvisited, we need to visit both of
            // them.

            // Split the traversal.
            // First make the top of the current corner stack point to the left
            // face (this one will be processed second).
            corner_traversal_stack_.back() = left_corner_id;
            // Add a new corner to the top of the stack (right face needs to
            // be traversed first).
            corner_traversal_stack_.push_back(right_corner_id);
            // Break from the while (true) loop.
            break;
          }
        }
      }
    }
    return true;
  }